

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong *puVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 ai;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar49;
  uint uVar50;
  undefined1 auVar48 [16];
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  NodeRef stack [244];
  undefined8 local_8a8;
  float fStack_8a0;
  float fStack_89c;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar22._4_4_ = fVar3;
  auVar22._0_4_ = fVar3;
  auVar22._8_4_ = fVar3;
  auVar22._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar23._4_4_ = fVar4;
  auVar23._0_4_ = fVar4;
  auVar23._8_4_ = fVar4;
  auVar23._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar24._4_4_ = fVar5;
  auVar24._0_4_ = fVar5;
  auVar24._8_4_ = fVar5;
  auVar24._12_4_ = fVar5;
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = fVar5 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar13 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar32._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar32._8_4_ = -fVar3;
  auVar32._12_4_ = -fVar3;
  auVar33._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar33._8_4_ = -fVar4;
  auVar33._12_4_ = -fVar4;
  auVar34._0_8_ = CONCAT44(fVar5,fVar5) ^ 0x8000000080000000;
  auVar34._8_4_ = -fVar5;
  auVar34._12_4_ = -fVar5;
  iVar10 = (tray->tnear).field_0.i[k];
  auVar35._4_4_ = iVar10;
  auVar35._0_4_ = iVar10;
  auVar35._8_4_ = iVar10;
  auVar35._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar36._4_4_ = iVar10;
  auVar36._0_4_ = iVar10;
  auVar36._8_4_ = iVar10;
  auVar36._12_4_ = iVar10;
  auVar25._8_4_ = 0x7fffffff;
  auVar25._0_8_ = 0x7fffffff7fffffff;
  auVar25._12_4_ = 0x7fffffff;
  puVar21 = local_7d0;
LAB_015e168f:
  do {
    puVar16 = puVar21;
    if (puVar16 == &local_7d8) {
LAB_015e1a4e:
      return puVar16 != &local_7d8;
    }
    puVar21 = puVar16 + -1;
    uVar14 = puVar16[-1];
    while ((uVar14 & 8) == 0) {
      auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar13),auVar32,auVar22);
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar17),auVar33,auVar23);
      auVar8 = vpmaxsd_avx(auVar8,auVar31);
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar18),auVar34,auVar24);
      auVar31 = vpmaxsd_avx(auVar31,auVar35);
      auVar8 = vpmaxsd_avx(auVar8,auVar31);
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar13 ^ 0x10)),auVar32,
                                auVar22);
      auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar17 ^ 0x10)),auVar33,
                                auVar23);
      auVar31 = vpminsd_avx(auVar31,auVar40);
      auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar18 ^ 0x10)),auVar34,
                                auVar24);
      auVar40 = vpminsd_avx(auVar40,auVar36);
      auVar31 = vpminsd_avx(auVar31,auVar40);
      auVar8 = vpcmpgtd_avx(auVar8,auVar31);
      iVar10 = vmovmskps_avx(auVar8);
      if (iVar10 == 0xf) goto LAB_015e168f;
      bVar9 = (byte)iVar10 ^ 0xf;
      uVar11 = uVar14 & 0xfffffffffffffff0;
      lVar15 = 0;
      for (uVar14 = (ulong)bVar9; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
        lVar15 = lVar15 + 1;
      }
      uVar14 = *(ulong *)(uVar11 + lVar15 * 8);
      uVar19 = bVar9 - 1 & (uint)bVar9;
      uVar20 = (ulong)uVar19;
      if (uVar19 != 0) {
        do {
          *puVar21 = uVar14;
          puVar21 = puVar21 + 1;
          lVar15 = 0;
          for (uVar14 = uVar20; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar15 = lVar15 + 1;
          }
          uVar20 = uVar20 - 1 & uVar20;
          uVar14 = *(ulong *)(uVar11 + lVar15 * 8);
        } while (uVar20 != 0);
      }
    }
    uVar11 = uVar14 & 0xfffffffffffffff0;
    for (lVar15 = 0; lVar15 != (ulong)((uint)uVar14 & 0xf) - 8; lVar15 = lVar15 + 1) {
      lVar12 = lVar15 * 0xb0;
      auVar8 = *(undefined1 (*) [16])(uVar11 + 0x80 + lVar12);
      pauVar1 = (undefined1 (*) [16])(uVar11 + 0x40 + lVar12);
      auVar31 = *(undefined1 (*) [16])(uVar11 + 0x70 + lVar12);
      auVar40 = *(undefined1 (*) [16])(uVar11 + 0x50 + lVar12);
      auVar26._0_4_ = auVar8._0_4_ * *(float *)*pauVar1;
      auVar26._4_4_ = auVar8._4_4_ * *(float *)(*pauVar1 + 4);
      auVar26._8_4_ = auVar8._8_4_ * *(float *)(*pauVar1 + 8);
      auVar26._12_4_ = auVar8._12_4_ * *(float *)(*pauVar1 + 0xc);
      auVar41 = vfmsub231ps_fma(auVar26,auVar31,auVar40);
      pauVar2 = (undefined1 (*) [16])(uVar11 + 0x60 + lVar12);
      auVar26 = *(undefined1 (*) [16])(uVar11 + 0x30 + lVar12);
      auVar27._0_4_ = auVar40._0_4_ * *(float *)*pauVar2;
      auVar27._4_4_ = auVar40._4_4_ * *(float *)(*pauVar2 + 4);
      auVar27._8_4_ = auVar40._8_4_ * *(float *)(*pauVar2 + 8);
      auVar27._12_4_ = auVar40._12_4_ * *(float *)(*pauVar2 + 0xc);
      auVar43 = vfmsub231ps_fma(auVar27,auVar8,auVar26);
      uVar6 = *(undefined4 *)(ray + k * 4);
      auVar37._4_4_ = uVar6;
      auVar37._0_4_ = uVar6;
      auVar37._8_4_ = uVar6;
      auVar37._12_4_ = uVar6;
      auVar27 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + lVar12),auVar37);
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar28._4_4_ = uVar6;
      auVar28._0_4_ = uVar6;
      auVar28._8_4_ = uVar6;
      auVar28._12_4_ = uVar6;
      auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x10 + lVar12),auVar28);
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar29._4_4_ = uVar6;
      auVar29._0_4_ = uVar6;
      auVar29._8_4_ = uVar6;
      auVar29._12_4_ = uVar6;
      auVar29 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + lVar12),auVar29);
      fVar3 = *(float *)(ray + k * 4 + 0x80);
      auVar44._4_4_ = fVar3;
      auVar44._0_4_ = fVar3;
      auVar44._8_4_ = fVar3;
      auVar44._12_4_ = fVar3;
      fVar4 = *(float *)(ray + k * 4 + 0xa0);
      auVar48._4_4_ = fVar4;
      auVar48._0_4_ = fVar4;
      auVar48._8_4_ = fVar4;
      auVar48._12_4_ = fVar4;
      fVar5 = *(float *)(ray + k * 4 + 0xc0);
      auVar30._4_4_ = fVar5;
      auVar30._0_4_ = fVar5;
      auVar30._8_4_ = fVar5;
      auVar30._12_4_ = fVar5;
      auVar38._0_4_ = fVar3 * auVar28._0_4_;
      auVar38._4_4_ = fVar3 * auVar28._4_4_;
      auVar38._8_4_ = fVar3 * auVar28._8_4_;
      auVar38._12_4_ = fVar3 * auVar28._12_4_;
      auVar37 = vfmsub231ps_fma(auVar38,auVar27,auVar48);
      auVar55._0_4_ = auVar8._0_4_ * auVar37._0_4_;
      auVar55._4_4_ = auVar8._4_4_ * auVar37._4_4_;
      auVar55._8_4_ = auVar8._8_4_ * auVar37._8_4_;
      auVar55._12_4_ = auVar8._12_4_ * auVar37._12_4_;
      auVar39._0_4_ = auVar40._0_4_ * auVar37._0_4_;
      auVar39._4_4_ = auVar40._4_4_ * auVar37._4_4_;
      auVar39._8_4_ = auVar40._8_4_ * auVar37._8_4_;
      auVar39._12_4_ = auVar40._12_4_ * auVar37._12_4_;
      auVar53._0_4_ = auVar27._0_4_ * fVar5;
      auVar53._4_4_ = auVar27._4_4_ * fVar5;
      auVar53._8_4_ = auVar27._8_4_ * fVar5;
      auVar53._12_4_ = auVar27._12_4_ * fVar5;
      auVar40 = vfmsub231ps_fma(auVar53,auVar29,auVar44);
      auVar8 = vfmadd231ps_fma(auVar55,auVar40,auVar31);
      auVar40 = vfmadd231ps_fma(auVar39,*pauVar1,auVar40);
      local_8a8._0_4_ = auVar26._0_4_;
      local_8a8._4_4_ = auVar26._4_4_;
      fStack_8a0 = auVar26._8_4_;
      fStack_89c = auVar26._12_4_;
      auVar52._0_4_ = auVar31._0_4_ * (float)local_8a8;
      auVar52._4_4_ = auVar31._4_4_ * local_8a8._4_4_;
      auVar52._8_4_ = auVar31._8_4_ * fStack_8a0;
      auVar52._12_4_ = auVar31._12_4_ * fStack_89c;
      auVar38 = vfmsub231ps_fma(auVar52,*pauVar2,*pauVar1);
      auVar54._0_4_ = fVar4 * auVar29._0_4_;
      auVar54._4_4_ = fVar4 * auVar29._4_4_;
      auVar54._8_4_ = fVar4 * auVar29._8_4_;
      auVar54._12_4_ = fVar4 * auVar29._12_4_;
      auVar30 = vfmsub231ps_fma(auVar54,auVar30,auVar28);
      auVar31._0_4_ = auVar38._0_4_ * fVar5;
      auVar31._4_4_ = auVar38._4_4_ * fVar5;
      auVar31._8_4_ = auVar38._8_4_ * fVar5;
      auVar31._12_4_ = auVar38._12_4_ * fVar5;
      auVar31 = vfmadd231ps_fma(auVar31,auVar48,auVar43);
      auVar37 = vfmadd231ps_fma(auVar31,auVar44,auVar41);
      auVar31 = vfmadd231ps_fma(auVar8,auVar30,*pauVar2);
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar8 = vandps_avx(auVar37,auVar8);
      uVar19 = auVar8._0_4_;
      auVar45._0_4_ = (float)(uVar19 ^ auVar31._0_4_);
      uVar49 = auVar8._4_4_;
      auVar45._4_4_ = (float)(uVar49 ^ auVar31._4_4_);
      uVar50 = auVar8._8_4_;
      auVar45._8_4_ = (float)(uVar50 ^ auVar31._8_4_);
      uVar51 = auVar8._12_4_;
      auVar45._12_4_ = (float)(uVar51 ^ auVar31._12_4_);
      auVar8 = vfmadd231ps_fma(auVar40,auVar30,auVar26);
      auVar40._0_4_ = (float)(uVar19 ^ auVar8._0_4_);
      auVar40._4_4_ = (float)(uVar49 ^ auVar8._4_4_);
      auVar40._8_4_ = (float)(uVar50 ^ auVar8._8_4_);
      auVar40._12_4_ = (float)(uVar51 ^ auVar8._12_4_);
      auVar26 = ZEXT816(0) << 0x20;
      auVar8 = vcmpps_avx(auVar45,auVar26,5);
      auVar31 = vcmpps_avx(auVar40,auVar26,5);
      auVar8 = vandps_avx(auVar8,auVar31);
      auVar31 = vcmpps_avx(auVar26,auVar37,4);
      auVar8 = vandps_avx(auVar8,auVar31);
      auVar46._0_4_ = auVar45._0_4_ + auVar40._0_4_;
      auVar46._4_4_ = auVar45._4_4_ + auVar40._4_4_;
      auVar46._8_4_ = auVar45._8_4_ + auVar40._8_4_;
      auVar46._12_4_ = auVar45._12_4_ + auVar40._12_4_;
      auVar31 = vandps_avx(auVar37,auVar25);
      auVar40 = vcmpps_avx(auVar46,auVar31,2);
      auVar26 = auVar40 & auVar8;
      if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0'
         ) {
        auVar8 = vandps_avx(auVar8,auVar40);
        auVar42._0_4_ = auVar38._0_4_ * auVar29._0_4_;
        auVar42._4_4_ = auVar38._4_4_ * auVar29._4_4_;
        auVar42._8_4_ = auVar38._8_4_ * auVar29._8_4_;
        auVar42._12_4_ = auVar38._12_4_ * auVar29._12_4_;
        auVar40 = vfmadd132ps_fma(auVar28,auVar42,auVar43);
        auVar40 = vfmadd132ps_fma(auVar27,auVar40,auVar41);
        auVar43._0_4_ = uVar19 ^ auVar40._0_4_;
        auVar43._4_4_ = uVar49 ^ auVar40._4_4_;
        auVar43._8_4_ = uVar50 ^ auVar40._8_4_;
        auVar43._12_4_ = uVar51 ^ auVar40._12_4_;
        fVar3 = *(float *)(ray + k * 4 + 0x60);
        auVar47._0_4_ = auVar31._0_4_ * fVar3;
        auVar47._4_4_ = auVar31._4_4_ * fVar3;
        auVar47._8_4_ = auVar31._8_4_ * fVar3;
        auVar47._12_4_ = auVar31._12_4_ * fVar3;
        auVar40 = vcmpps_avx(auVar47,auVar43,1);
        fVar3 = *(float *)(ray + k * 4 + 0x100);
        auVar41._0_4_ = auVar31._0_4_ * fVar3;
        auVar41._4_4_ = auVar31._4_4_ * fVar3;
        auVar41._8_4_ = auVar31._8_4_ * fVar3;
        auVar41._12_4_ = auVar31._12_4_ * fVar3;
        auVar31 = vcmpps_avx(auVar43,auVar41,2);
        auVar31 = vandps_avx(auVar40,auVar31);
        auVar8 = vandps_avx(auVar31,auVar8);
        iVar10 = vmovmskps_avx(auVar8);
        if (iVar10 != 0) {
          local_8a8._0_1_ = (byte)iVar10;
          local_8a8 = (ulong)(byte)local_8a8;
          do {
            uVar20 = 0;
            for (uVar7 = local_8a8; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
              uVar20 = uVar20 + 1;
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar12 + uVar11 + 0x90 + uVar20 * 4)]
                 .ptr)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_015e1a4e;
            }
            local_8a8 = local_8a8 ^ 1L << (uVar20 & 0x3f);
          } while (local_8a8 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }